

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

Var __thiscall Gluco::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  vec<char> *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  int size;
  int size_00;
  double dVar6;
  VarData local_48;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,dvar);
  local_40 = (undefined4)CONCAT71(in_register_00000031,sign);
  iVar2 = (this->vardata).sz;
  size = iVar2 * 2 + 1;
  vec<Gluco::vec<Gluco::Solver::Watcher>_>::growTo(&(this->watches).occs,size);
  pvVar1 = &(this->watches).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  size_00 = iVar2 * 2 + 2;
  local_38 = (long)iVar2;
  vec<Gluco::vec<Gluco::Solver::Watcher>_>::growTo(&(this->watches).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  vec<Gluco::vec<Gluco::Solver::Watcher>_>::growTo(&(this->watchesBin).occs,size);
  pvVar1 = &(this->watchesBin).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  vec<Gluco::vec<Gluco::Solver::Watcher>_>::growTo(&(this->watchesBin).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  local_48.reason._0_1_ = 2;
  vec<Gluco::lbool>::push(&this->assigns,(lbool *)&local_48);
  local_48.reason = 0xffffffff;
  local_48.level = 0;
  vec<Gluco::Solver::VarData>::push(&this->vardata,&local_48);
  local_48.reason = 0;
  local_48.level = 0;
  if (this->rnd_init_act == true) {
    dVar6 = this->random_seed * 1389796.0;
    dVar6 = dVar6 - (double)(int)(dVar6 / 2147483647.0) * 2147483647.0;
    this->random_seed = dVar6;
    local_48 = (VarData)((dVar6 / 2147483647.0) * 1e-05);
  }
  vec<double>::push(&this->activity,(double *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::push(&this->seen,(char *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->permDiff,&local_48.reason);
  local_48.reason._0_1_ = (char)local_40;
  vec<char>::push(&this->polarity,(char *)&local_48);
  pvVar1 = &this->decision;
  vec<char>::push(pvVar1);
  lVar3 = local_38;
  iVar2 = (int)local_38;
  vec<Gluco::Lit>::capacity(&this->trail,iVar2 + 1);
  cVar5 = (char)local_3c;
  if (cVar5 == '\0') {
LAB_005b6e39:
    lVar4 = -1;
    if (pvVar1->data[lVar3] == '\0') goto LAB_005b6e57;
  }
  else {
    if (pvVar1->data[lVar3] != '\0') {
      if (cVar5 != '\0') goto LAB_005b6e57;
      goto LAB_005b6e39;
    }
    lVar4 = 1;
  }
  this->dec_vars = this->dec_vars + lVar4;
LAB_005b6e57:
  (this->decision).data[lVar3] = cVar5;
  if ((((this->order_heap).indices.sz <= iVar2) || ((this->order_heap).indices.data[lVar3] < 0)) &&
     (pvVar1->data[lVar3] != '\0')) {
    Heap<Gluco::Solver::VarOrderLt>::insert(&this->order_heap,iVar2);
  }
  return iVar2;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar)
{
    int v = nVars();
    watches  .init(mkLit(v, false));
    watches  .init(mkLit(v, true ));
    watchesBin  .init(mkLit(v, false));
    watchesBin  .init(mkLit(v, true ));
    assigns  .push(l_Undef);
    vardata  .push(mkVarData(CRef_Undef, 0));
    //activity .push(0);
    activity .push(rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen     .push(0);
    permDiff .push(0);
    polarity .push(sign);
    decision .push();
    trail    .capacity(v+1);
    setDecisionVar(v, dvar);
    return v;
}